

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O2

int fire_damage(obj *chain,boolean force,boolean here,xchar x,xchar y)

{
  short sVar1;
  obj *poVar2;
  byte bVar3;
  boolean bVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  char *pcVar10;
  int iVar11;
  char *pcVar12;
  obj *obj;
  obj *obj_00;
  int local_44;
  
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00258859;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00258854;
LAB_00258886:
    bVar3 = viz_array[y][x] & 1;
  }
  else {
LAB_00258854:
    if (ublindf != (obj *)0x0) {
LAB_00258859:
      if (ublindf->oartifact == '\x1d') goto LAB_00258886;
    }
    bVar3 = 0;
  }
  local_44 = 0;
LAB_002588ca:
  do {
    while( true ) {
      do {
        obj = chain;
        if (obj == (obj *)0x0) {
          if (local_44 != 0 && bVar3 == 0) {
            pline("You smell smoke.");
          }
          return local_44;
        }
        chain = *(obj **)(obj->oextra + (ulong)(here != '\0') * 2 + -0x19);
        bVar4 = catch_lit(obj);
      } while (bVar4 != '\0');
      if (7 < (ushort)(obj->otyp - 0xdaU)) break;
      bVar5 = (byte)obj->otyp;
      if (1 < bVar5 - 0xdc) {
        iVar8 = 0x28;
        if (bVar5 != 0xdb) {
          if (bVar5 == 0xda) {
            iVar8 = 0x1e;
          }
          else {
            iVar8 = 0x14;
          }
        }
        if ((force != '\0') ||
           (iVar7 = (int)u.uluck, iVar11 = (int)u.moreluck, iVar8 = rn2(iVar8),
           iVar7 + iVar11 + 5 <= iVar8)) {
          if (bVar3 == 0) {
            poVar2 = obj->cobj;
            if (obj->cobj != (obj *)0x0) goto LAB_00258b7d;
          }
          else {
            pcVar9 = Yname2(obj);
            pline("%s catches fire and burns.",pcVar9);
            if (obj->cobj != (obj *)0x0) {
              pline("Its contents fall out.");
              poVar2 = obj->cobj;
LAB_00258b7d:
              while (obj_00 = poVar2, obj_00 != (obj *)0x0) {
                poVar2 = obj_00->nobj;
                obj_extract_self(obj_00);
                bVar4 = flooreffects(obj_00,(int)x,(int)y,"");
                if (bVar4 == '\0') {
                  place_object(obj_00,level,(int)x,(int)y);
                }
              }
            }
          }
          delobj(obj);
          local_44 = local_44 + 1;
        }
      }
    }
  } while ((force == '\0') &&
          (iVar8 = (int)u.uluck, iVar7 = (int)u.moreluck, uVar6 = mt_random(),
          (int)(uVar6 % 0x14) < iVar8 + iVar7 + 5));
  bVar5 = obj->oclass;
  if (bVar5 - 9 < 2) {
    sVar1 = obj->otyp;
    if ((sVar1 == 0x162) || (sVar1 == 0x17f)) goto LAB_002588ca;
    if (sVar1 == 0x1bd) {
      if (bVar3 != 0) {
        pcVar9 = xname(obj);
        pcVar9 = the(pcVar9);
        pline("Smoke rises from %s.",pcVar9);
      }
      goto LAB_002588ca;
    }
    if (bVar3 != 0) {
      pcVar10 = Yname2(obj);
      pcVar9 = destroy_strings[(ulong)((uint)(1 < obj->quan) + (uint)(bVar5 != 9) * 3) + 6];
LAB_00258bd5:
      pline("%s %s.",pcVar10,pcVar9);
    }
  }
  else {
    if (bVar5 != 8) {
      bVar4 = is_flammable(obj);
      if (((bVar4 != '\0') &&
          (uVar6 = *(uint *)&obj->field_0x4a, (uVar6 >> 0xc & 1) == 0 && (~uVar6 & 0x300) != 0)) &&
         (((uVar6 & 2) == 0 || (iVar8 = rnl(4), iVar8 != 0)))) {
        if (bVar3 != 0) {
          pcVar9 = Yname2(obj);
          pcVar10 = otense(obj,"burn");
          uVar6 = *(uint *)&obj->field_0x4a >> 8 & 3;
          pcVar12 = " further";
          if (uVar6 == 0) {
            pcVar12 = "";
          }
          if (uVar6 == 2) {
            pcVar12 = " completely";
          }
          pline("%s %s%s.",pcVar9,pcVar10,pcVar12);
        }
        *(uint *)&obj->field_0x4a =
             *(uint *)&obj->field_0x4a & 0xfffffcff | *(uint *)&obj->field_0x4a + 0x100 & 0x300;
      }
      goto LAB_002588ca;
    }
    if (bVar3 != 0) {
      pcVar10 = Yname2(obj);
      pcVar9 = destroy_strings[(ulong)(1 < obj->quan) + 3];
      goto LAB_00258bd5;
    }
  }
  delobj(obj);
  local_44 = local_44 + 1;
  goto LAB_002588ca;
}

Assistant:

int fire_damage(struct obj *chain, boolean force, boolean here, xchar x, xchar y)
{
    int chance;
    struct obj *obj, *otmp, *nobj, *ncobj;
    int retval = 0;
    int in_sight = !Blind && couldsee(x, y);	/* Don't care if it's lit */
    int dindx;

    for (obj = chain; obj; obj = nobj) {
	nobj = here ? obj->nexthere : obj->nobj;

	/* object might light in a controlled manner */
	if (catch_lit(obj))
	    continue;

	if (Is_container(obj)) {
	    switch (obj->otyp) {
	    case ICE_BOX:
	    case IRON_SAFE:
		continue;		/* Immune */
		/*NOTREACHED*/
		break;
	    case CHEST:
		chance = 40;
		break;
	    case LARGE_BOX:
		chance = 30;
		break;
	    default:
		chance = 20;
		break;
	    }
	    if (!force && (Luck + 5) > rn2(chance))
		continue;
	    /* Container is burnt up - dump contents out */
	    if (in_sight) pline("%s catches fire and burns.", Yname2(obj));
	    if (Has_contents(obj)) {
		if (in_sight) pline("Its contents fall out.");
		for (otmp = obj->cobj; otmp; otmp = ncobj) {
		    ncobj = otmp->nobj;
		    obj_extract_self(otmp);
		    if (!flooreffects(otmp, x, y, ""))
			place_object(otmp, level, x, y);
		}
	    }
	    delobj(obj);
	    retval++;
	} else if (!force && (Luck + 5) > rn2(20)) {
	    /*  chance per item of sustaining damage:
	     *	max luck (full moon):	 5%
	     *	max luck (elsewhen):	10%
	     *	avg luck (Luck==0):	75%
	     *	awful luck (Luck<-4):  100%
	     */
	    continue;
	} else if (obj->oclass == SCROLL_CLASS || obj->oclass == SPBOOK_CLASS) {
	    if (obj->otyp == SCR_FIRE || obj->otyp == SPE_FIREBALL)
		continue;
	    if (obj->otyp == SPE_BOOK_OF_THE_DEAD) {
		if (in_sight) pline("Smoke rises from %s.", the(xname(obj)));
		continue;
	    }
	    dindx = (obj->oclass == SCROLL_CLASS) ? 2 : 3;
	    if (in_sight)
		pline("%s %s.", Yname2(obj), (obj->quan > 1) ?
		      destroy_strings[dindx*3 + 1] : destroy_strings[dindx*3]);
	    delobj(obj);
	    retval++;
	} else if (obj->oclass == POTION_CLASS) {
	    dindx = 1;
	    if (in_sight)
		pline("%s %s.", Yname2(obj), (obj->quan > 1) ?
		      destroy_strings[dindx*3 + 1] : destroy_strings[dindx*3]);
	    delobj(obj);
	    retval++;
	} else if (is_flammable(obj) && obj->oeroded < MAX_ERODE &&
		   !(obj->oerodeproof || (obj->blessed && !rnl(4)))) {
	    if (in_sight) {
		pline("%s %s%s.", Yname2(obj), otense(obj, "burn"),
		      obj->oeroded+1 == MAX_ERODE ? " completely" :
		      obj->oeroded ? " further" : "");
	    }
	    obj->oeroded++;
	}
    }

    if (retval && !in_sight)
	pline("You smell smoke.");
    return retval;
}